

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::MaskConstancyCase::init
          (MaskConstancyCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  allocator<char> local_3d;
  GLint maxSampleMaskWords;
  string local_38;
  
  iVar1 = (*((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  if ((this->super_DefaultFBOMultisampleCase).field_0xb4 == '\x01') {
    ctx = (EVP_PKEY_CTX *)&maxSampleMaskWords;
    maxSampleMaskWords = 0;
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x8e59);
    if (maxSampleMaskWords <= ((this->super_DefaultFBOMultisampleCase).m_numSamples + -1) / 0x20) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Test requires larger GL_MAX_SAMPLE_MASK_WORDS",&local_3d);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar1 = DefaultFBOMultisampleCase::init(&this->super_DefaultFBOMultisampleCase,ctx);
  return iVar1;
}

Assistant:

void MaskConstancyCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// check the test is even possible
	if (m_isSampleMaskCase)
	{
		GLint maxSampleMaskWords = 0;
		gl.getIntegerv(GL_MAX_SAMPLE_MASK_WORDS, &maxSampleMaskWords);
		if (getEffectiveSampleMaskWordCount(m_numSamples - 1) > maxSampleMaskWords)
			throw tcu::NotSupportedError("Test requires larger GL_MAX_SAMPLE_MASK_WORDS");
	}

	// normal init
	DefaultFBOMultisampleCase::init();
}